

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferDataUploadCase::testBufferUpload
          (BufferDataUploadCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  deUint64 dVar4;
  reference pvVar5;
  deUint64 dVar6;
  deUint64 endTime;
  deUint64 startTime;
  Functions *gl;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *result_local;
  BufferDataUploadCase *this_local;
  
  pRVar3 = gles3::Context::getRenderContext
                     ((this->
                      super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    .m_bufferID);
  dVar4 = deGetMicroseconds();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x150);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&(this->
                       super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       ).m_zeroData,0);
  (*pcVar1)(0x8892,(long)bufferSize,pvVar5,
            (this->
            super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).m_bufferUsage);
  dVar6 = deGetMicroseconds();
  (result->duration).totalDuration = dVar6 - dVar4;
  (result->duration).fitResponseDuration = (result->duration).totalDuration;
  result->writtenSize = bufferSize;
  return;
}

Assistant:

void BufferDataUploadCase::testBufferUpload (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bufferID);

	// upload
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		gl.bufferData(GL_ARRAY_BUFFER, bufferSize, &m_zeroData[0], m_bufferUsage);
		endTime = deGetMicroseconds();

		result.duration.totalDuration = endTime - startTime;
		result.duration.fitResponseDuration = result.duration.totalDuration;
		result.writtenSize = bufferSize;
	}
}